

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHDiv.cpp
# Opt level: O1

void TPZShapeHDiv<pzshape::TPZShapeCube>::ComputeVecandShape(TPZShapeData *data)

{
  pair<int,_long> *ppVar1;
  int iVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  int iVar7;
  int iVar8;
  MElementType MVar9;
  int *piVar10;
  ostream *this;
  long *plVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  int iVar18;
  long lVar19;
  bool bVar20;
  bool bVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  int maxorder [3];
  int scalarorder;
  TPZGenMatrix<int> shapeorders;
  TPZManVector<long,_27> FirstIndex;
  TPZManVector<int,_10> facevector;
  TPZManVector<int,_81> vecpermute;
  TPZManVector<int,_81> VectorSides;
  TPZManVector<int,_81> bilinear;
  TPZManVector<int,_81> normalsides;
  TPZManVector<int,_81> directions;
  int local_904 [3];
  TPZVec<int> *local_8f8;
  ulong local_8f0;
  long local_8e8;
  long local_8e0;
  int local_8d8;
  int local_8d4;
  long local_8d0;
  ulong local_8c8;
  TPZManVector<int,_10> local_8c0;
  TPZManVector<long,_27> local_878;
  TPZManVector<int,_10> local_780;
  TPZVec<int> local_738;
  int local_718 [82];
  TPZVec<int> local_5d0;
  int local_5b0 [82];
  TPZVec<int> local_468;
  int local_448 [82];
  TPZVec<int> local_300;
  int local_2e0 [82];
  TPZVec<int> local_198;
  int local_178 [82];
  
  TPZVec<int>::TPZVec(&local_5d0,0);
  local_5d0._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018e4fb0;
  local_5d0.fStore = local_5b0;
  local_5d0.fNElements = 0x51;
  local_5d0.fNAlloc = 0;
  TPZVec<int>::TPZVec(&local_468,0);
  local_468.fStore = local_448;
  local_468._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018e4fb0;
  local_468.fNElements = 0x51;
  local_468.fNAlloc = 0;
  TPZVec<int>::TPZVec(&local_198,0);
  local_198.fStore = local_178;
  local_198._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018e4fb0;
  local_198.fNElements = 0x51;
  local_198.fNAlloc = 0;
  TPZVec<int>::TPZVec(&local_300,0);
  local_300.fStore = local_2e0;
  local_300._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018e4fb0;
  local_300.fNElements = 0x51;
  local_300.fNAlloc = 0;
  pztopology::TPZCube::GetSideHDivDirections(&local_5d0,&local_198,&local_468,&local_300);
  if ((data->fSDVecShapeIndex).super_TPZVec<std::pair<int,_long>_>.fNElements == 0) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/TPZShapeHDiv.cpp"
               ,0x6c);
  }
  local_8d8 = (data->fHDivConnectOrders).super_TPZVec<int>.fStore[6];
  iVar7 = pzshape::TPZShapeCube::NShapeF(&(data->fH1ConnectOrders).super_TPZVec<int>);
  local_738._vptr_TPZVec = (_func_int **)CONCAT44(local_738._vptr_TPZVec._4_4_,0x1a);
  TPZManVector<int,_10>::TPZManVector(&local_780,local_5d0.fNElements,(int *)&local_738);
  uVar17 = 0;
  local_8f8 = &(data->fH1ConnectOrders).super_TPZVec<int>;
  TPZVec<int>::TPZVec(&local_738,0);
  local_738.fStore = local_718;
  local_738._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018e4fb0;
  local_738.fNElements = 0x51;
  local_738.fNAlloc = 0;
  iVar18 = 0;
  do {
    iVar8 = pztopology::TPZCube::SideDimension(iVar18);
    if (iVar8 == 2) {
      TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)&local_8c0);
      pztopology::TPZCube::LowerDimensionSides(iVar18,(TPZStack<int,_10> *)&local_8c0);
      uVar6 = (uint)local_8c0.super_TPZVec<int>.fNElements;
      uVar15 = (uint)local_8c0.super_TPZVec<int>.fNElements + 1;
      TPZManVector<int,_27>::TPZManVector((TPZManVector<int,_27> *)&local_878,(long)(int)uVar15);
      HDivPermutation(iVar18,data,(TPZVec<int> *)&local_878);
      if (uVar6 < 0x7fffffff) {
        uVar16 = 0;
        do {
          local_738.fStore[(long)(int)uVar17 + uVar16] =
               *(int *)((long)local_878.super_TPZVec<long>.fStore + uVar16 * 4) + uVar17;
          local_780.super_TPZVec<int>.fStore[(long)(int)uVar17 + uVar16] = iVar18;
          uVar16 = uVar16 + 1;
        } while (uVar15 != uVar16);
        uVar17 = uVar17 + (int)uVar16;
      }
      if (local_878.super_TPZVec<long>.fStore == local_878.fExtAlloc) {
        local_878.super_TPZVec<long>.fStore = (long *)0x0;
      }
      local_878.super_TPZVec<long>.fNAlloc = 0;
      local_878.super_TPZVec<long>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
      if (local_878.super_TPZVec<long>.fStore != (long *)0x0) {
        operator_delete__(local_878.super_TPZVec<long>.fStore);
      }
      TPZManVector<int,_10>::~TPZManVector(&local_8c0);
    }
    auVar5 = _DAT_014f8350;
    auVar4 = _DAT_014f8340;
    iVar18 = iVar18 + 1;
  } while (iVar18 != 0x1b);
  lVar19 = (long)(int)uVar17;
  lVar13 = local_738.fNElements - lVar19;
  if (lVar13 != 0 && lVar19 <= local_738.fNElements) {
    lVar14 = lVar13 + -1;
    auVar22._8_4_ = (int)lVar14;
    auVar22._0_8_ = lVar14;
    auVar22._12_4_ = (int)((ulong)lVar14 >> 0x20);
    uVar16 = 0;
    auVar22 = auVar22 ^ _DAT_014f8350;
    uVar15 = uVar17;
    do {
      auVar23._8_4_ = (int)uVar16;
      auVar23._0_8_ = uVar16;
      auVar23._12_4_ = (int)(uVar16 >> 0x20);
      auVar23 = (auVar23 | auVar4) ^ auVar5;
      if ((bool)(~(auVar23._4_4_ == auVar22._4_4_ && auVar22._0_4_ < auVar23._0_4_ ||
                  auVar22._4_4_ < auVar23._4_4_) & 1)) {
        local_738.fStore[lVar19 + uVar16] = uVar15;
      }
      if ((auVar23._12_4_ != auVar22._12_4_ || auVar23._8_4_ <= auVar22._8_4_) &&
          auVar23._12_4_ <= auVar22._12_4_) {
        local_738.fStore[lVar19 + uVar16 + 1] = uVar15 + 1;
      }
      uVar16 = uVar16 + 2;
      uVar15 = uVar15 + 2;
    } while ((lVar13 + 1U & 0xfffffffffffffffe) != uVar16);
  }
  TPZGenMatrix<int>::TPZGenMatrix((TPZGenMatrix<int> *)&local_8c0,(long)iVar7,3);
  pzshape::TPZShapeCube::ShapeOrder
            (&(data->fCornerNodeIds).super_TPZVec<long>,local_8f8,(TPZGenMatrix<int> *)&local_8c0);
  local_8d4 = (data->fHDivConnectOrders).super_TPZVec<int>.fStore[6] + 1;
  TPZManVector<long,_27>::TPZManVector(&local_878,0x1c);
  FirstShapeIndex(&local_878.super_TPZVec<long>,&local_8d4);
  local_8d0 = local_5d0.fNElements;
  if ((int)uVar17 < 1) {
    iVar7 = 0;
  }
  else {
    local_8c8 = (ulong)uVar17;
    uVar16 = 0;
    iVar7 = 0;
    local_8e0 = lVar19;
    do {
      local_8e8 = (long)local_738.fStore[uVar16];
      local_8f8 = (TPZVec<int> *)(long)local_5d0.fStore[local_8e8];
      lVar13 = local_878.super_TPZVec<long>.fStore[(long)((long)&local_8f8->_vptr_TPZVec + 1)];
      local_8f0 = uVar16;
      if ((int)local_878.super_TPZVec<long>.fStore[(long)local_8f8] < (int)lVar13) {
        iVar18 = (data->fHDivConnectOrders).super_TPZVec<int>.fStore
                 [(long)local_780.super_TPZVec<int>.fStore[uVar16] + -0x14];
        lVar14 = (long)(int)local_878.super_TPZVec<long>.fStore[(long)local_8f8];
        do {
          uVar15 = pztopology::TPZCube::SideDimension((int)local_8f8);
          if ((int)uVar15 < 1) {
LAB_0101419a:
            ppVar1 = (data->fSDVecShapeIndex).super_TPZVec<std::pair<int,_long>_>.fStore;
            ppVar1[iVar7].first = (int)local_8e8;
            ppVar1[iVar7].second = lVar14;
            iVar7 = iVar7 + 1;
          }
          else {
            bVar3 = true;
            uVar16 = 0;
            do {
              piVar10 = TPZGenMatrix<int>::operator()((TPZGenMatrix<int> *)&local_8c0,lVar14,uVar16)
              ;
              if (iVar18 < *piVar10) {
                bVar3 = false;
              }
              uVar16 = uVar16 + 1;
            } while (uVar15 != uVar16);
            lVar19 = local_8e0;
            if (bVar3) goto LAB_0101419a;
          }
          lVar14 = lVar14 + 1;
        } while ((int)lVar14 != (int)lVar13);
      }
      uVar16 = local_8f0 + 1;
    } while (uVar16 != local_8c8);
  }
  if ((int)uVar17 < local_8d0) {
    do {
      local_8e8 = (long)local_738.fStore[lVar19];
      iVar18 = local_5d0.fStore[local_8e8];
      local_8f8 = (TPZVec<int> *)CONCAT44(local_8f8._4_4_,local_468.fStore[local_8e8]);
      local_8f0 = (ulong)local_198.fStore[local_8e8];
      MVar9 = pztopology::TPZCube::Type(iVar18);
      lVar13 = local_878.super_TPZVec<long>.fStore[(long)iVar18 + 1];
      if ((int)local_878.super_TPZVec<long>.fStore[iVar18] < (int)lVar13) {
        lVar14 = (long)(int)local_878.super_TPZVec<long>.fStore[iVar18];
        local_8e0 = lVar19;
        do {
          uVar17 = pztopology::TPZCube::SideDimension(iVar18);
          local_904[0] = local_8d8;
          local_904[1] = local_8d8;
          local_904[2] = local_8d8;
          if ((int)local_8f8 != 0) {
            local_904[local_8f0] = local_904[local_8f0] + 1;
          }
          if ((int)uVar17 < 1) {
LAB_0101436f:
            ppVar1 = (data->fSDVecShapeIndex).super_TPZVec<std::pair<int,_long>_>.fStore;
            ppVar1[iVar7].first = (int)local_8e8;
            ppVar1[iVar7].second = lVar14;
            iVar7 = iVar7 + 1;
          }
          else {
            bVar3 = true;
            uVar16 = 0;
            do {
              switch(MVar9) {
              case EOned:
                piVar10 = TPZGenMatrix<int>::operator()((TPZGenMatrix<int> *)&local_8c0,lVar14,0);
                break;
              case ETriangle:
              case ETetraedro:
                piVar10 = TPZGenMatrix<int>::operator()
                                    ((TPZGenMatrix<int> *)&local_8c0,lVar14,uVar16);
                iVar12 = local_904[uVar16] + 1;
                iVar8 = *piVar10;
                bVar21 = SBORROW4(iVar8,iVar12);
                iVar2 = iVar8 - iVar12;
                bVar20 = iVar8 == iVar12;
                goto LAB_0101434c;
              case EQuadrilateral:
                piVar10 = TPZGenMatrix<int>::operator()
                                    ((TPZGenMatrix<int> *)&local_8c0,lVar14,uVar16);
                break;
              case EPiramide:
                piVar10 = TPZGenMatrix<int>::operator()
                                    ((TPZGenMatrix<int> *)&local_8c0,lVar14,uVar16);
                break;
              case EPrisma:
                piVar10 = TPZGenMatrix<int>::operator()
                                    ((TPZGenMatrix<int> *)&local_8c0,lVar14,uVar16);
                break;
              case ECube:
                piVar10 = TPZGenMatrix<int>::operator()
                                    ((TPZGenMatrix<int> *)&local_8c0,lVar14,uVar16);
                break;
              default:
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/TPZShapeHDiv.cpp"
                           ,0x104);
              }
              iVar12 = *piVar10;
              iVar8 = local_904[uVar16];
              bVar21 = SBORROW4(iVar12,iVar8);
              iVar2 = iVar12 - iVar8;
              bVar20 = iVar12 == iVar8;
LAB_0101434c:
              if (!bVar20 && bVar21 == iVar2 < 0) {
                bVar3 = false;
              }
              uVar16 = uVar16 + 1;
            } while (uVar17 != uVar16);
            lVar19 = local_8e0;
            if (bVar3) goto LAB_0101436f;
          }
          lVar14 = lVar14 + 1;
        } while ((int)lVar14 != (int)lVar13);
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 < local_8d0);
  }
  iVar18 = (int)(data->fSDVecShapeIndex).super_TPZVec<std::pair<int,_long>_>.fNElements;
  if (iVar7 == iVar18) {
    if (local_878.super_TPZVec<long>.fStore == local_878.fExtAlloc) {
      local_878.super_TPZVec<long>.fStore = (long *)0x0;
    }
    local_878.super_TPZVec<long>.fNAlloc = 0;
    local_878.super_TPZVec<long>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5f0;
    if (local_878.super_TPZVec<long>.fStore != (long *)0x0) {
      operator_delete__(local_878.super_TPZVec<long>.fStore);
    }
    TPZGenMatrix<int>::~TPZGenMatrix((TPZGenMatrix<int> *)&local_8c0);
    if (local_738.fStore == local_718) {
      local_738.fStore = (int *)0x0;
    }
    local_738.fNAlloc = 0;
    local_738._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
    if (local_738.fStore != (int *)0x0) {
      operator_delete__(local_738.fStore);
    }
    TPZManVector<int,_10>::~TPZManVector(&local_780);
    if (local_300.fStore == local_2e0) {
      local_300.fStore = (int *)0x0;
    }
    local_300.fNAlloc = 0;
    local_300._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
    if (local_300.fStore != (int *)0x0) {
      operator_delete__(local_300.fStore);
    }
    if (local_198.fStore == local_178) {
      local_198.fStore = (int *)0x0;
    }
    local_198.fNAlloc = 0;
    local_198._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
    if (local_198.fStore != (int *)0x0) {
      operator_delete__(local_198.fStore);
    }
    if (local_468.fStore == local_448) {
      local_468.fStore = (int *)0x0;
    }
    local_468.fNAlloc = 0;
    local_468._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
    if (local_468.fStore != (int *)0x0) {
      operator_delete__(local_468.fStore);
    }
    if (local_5d0.fStore == local_5b0) {
      local_5d0.fStore = (int *)0x0;
    }
    local_5d0.fNAlloc = 0;
    local_5d0._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
    if (local_5d0.fStore != (int *)0x0) {
      operator_delete__(local_5d0.fStore);
    }
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"count ",6);
  this = (ostream *)std::ostream::operator<<(&std::cout,iVar7);
  std::__ostream_insert<char,std::char_traits<char>>(this,"\nivs ",5);
  plVar11 = (long *)std::ostream::operator<<(this,iVar18);
  std::ios::widen((char)*(undefined8 *)(*plVar11 + -0x18) + (char)plVar11);
  std::ostream::put((char)plVar11);
  std::ostream::flush();
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/TPZShapeHDiv.cpp"
             ,0x113);
}

Assistant:

void TPZShapeHDiv<TSHAPE>::ComputeVecandShape(TPZShapeData &data) {
    const int64_t numvec = TSHAPE::Dimension*TSHAPE::NSides;
    TPZManVector<int,numvec> VectorSides(numvec),bilinear(numvec),directions(numvec);
    TPZManVector<int,numvec> normalsides(numvec);

    TSHAPE::GetSideHDivDirections(VectorSides,directions,bilinear,normalsides);

    if (data.fSDVecShapeIndex.size() == 0) {
        DebugStop();
    }
    
    // const int pressureorder = data.fHDivConnectOrders[TSHAPE::NFacets];//TODOPHIL
    const int pressureorder = data.fHDivConnectOrders[TSHAPE::NFacets];

    int nshape = TSHAPE::NShapeF(data.fH1ConnectOrders);

    int nexternalvectors = 0;
    TPZManVector<int> facevector(VectorSides.size(),TSHAPE::NSides-1);
    // compute the permutation which needs to be applied to the vectors to enforce compatibility between neighbours
    TPZManVector<int,81> vecpermute(TSHAPE::NSides*TSHAPE::Dimension);
    if (TSHAPE::Type() == EPiramide) {
        DebugStop();
    }
    int count = 0;
    for (int side = 0; side < TSHAPE::NSides; side++) {
        if (TSHAPE::SideDimension(side) != TSHAPE::Dimension -1) {
            continue;
        }
        TPZStack<int> smallsides;
        TSHAPE::LowerDimensionSides(side,smallsides);
//        TPZGeoElSide gelside(gel,side);
//        int nlowdim = gelside.NSides();
        const int nlowdim = smallsides.NElements()+1;
        TPZManVector<int,27> permgather(nlowdim);
        HDivPermutation(side,data, permgather);
        int counthold = count;
        for (int i=0; i<nlowdim; i++) {
            vecpermute[counthold+i] = permgather[i]+counthold;
            facevector[count] = side;
            count++;
        }
    }

    nexternalvectors = count;
    for (; count < vecpermute.size(); count++) {
        vecpermute[count] = count;
    }
    TPZGenMatrix<int> shapeorders(nshape,3);
    TSHAPE::ShapeOrder(data.fCornerNodeIds, data.fH1ConnectOrders, shapeorders);

//    int nshapeflux = NFluxShapeF();
//    IndexVecShape.Resize(nshapeflux);

    int scalarorder = data.fHDivConnectOrders[TSHAPE::NFacets]+1;
    // VectorSide indicates the side associated with each vector entry
    TPZManVector<int64_t,27> FirstIndex(TSHAPE::NSides+1);
    // the first index of the shape functions
    FirstShapeIndex(FirstIndex,scalarorder);

    int64_t nvec = VectorSides.NElements();
    count = 0;

    const int firstface = TSHAPE::NSides-TSHAPE::NFacets-1;
    for (int locvec = 0; locvec<nexternalvectors; locvec++) {
        int ivec = vecpermute[locvec];
        int side = VectorSides[ivec];
        int face = facevector[locvec];
//        int connectindex = SideConnectLocId(0, face);
        int connectindex = face-firstface;
//        int order = this->Connect(connectindex).Order();
        //int order = data.fHDivConnectOrders[connectindex];
        int order = data.fHDivConnectOrders[connectindex];//TODOPHIL

        int firstshape = FirstIndex[side];
        int lastshape = FirstIndex[side+1];

        for (int ish = firstshape; ish<lastshape; ish++) {
            int sidedimension = TSHAPE::SideDimension(side);
            int include=true;
            for (int d=0; d<sidedimension; d++)
            {
                if (shapeorders(ish,d) > order) {
                    include = false;
                }
            }
            if (include)
            {
                data.fSDVecShapeIndex[count] = std::make_pair(ivec, ish);
                count++;
            }
        }
    }


    for (int locvec = nexternalvectors; locvec<nvec; locvec++) {
        int ivec = vecpermute[locvec];
        int side = VectorSides[ivec];
        int bil = bilinear[ivec];
        int dir = directions[ivec];
        MElementType tipo = TSHAPE::Type(side);

        int firstshape = FirstIndex[side];
        int lastshape = FirstIndex[side+1];

        for (int ish = firstshape; ish<lastshape; ish++) {
            int sidedimension = TSHAPE::SideDimension(side);
            int maxorder[3] = {pressureorder,pressureorder,pressureorder};
            if (bil) {
                maxorder[dir]++;
            }
            int shord[3] = {0};
            int include=true;
            for (int d=0; d<sidedimension; d++)
            {
                if (tipo==ETriangle||tipo==ETetraedro)//
                {
                    shord[d] = shapeorders(ish,d);
                    int maxd = maxorder[d]+1;
                    if (shord[d] > maxd) {
                        include = false;
                    }
                }
                else if(tipo==EQuadrilateral)
                {
                    shord[d] = shapeorders(ish,d);
                    int maxd = maxorder[d];
                    if (shord[d] > maxd) {
                        include = false;
                    }
                }
                else if(tipo==ECube)
                {
                    shord[d] = shapeorders(ish,d);
                    if (shord[d] > maxorder[d]) {
                        include = false;
                    }
                }
                else if (tipo==EPrisma)
                {
                    //DebugStop();
                    if (shapeorders(ish,d) > maxorder[d]) {
                        include = false;
                    }
                }
                else if (tipo == EOned)
                {
                    shord[0] = shapeorders(ish,0);
                    if (shord[0] > maxorder[d]) {
                        include = false;
                    }
                }
                else if (tipo == EPiramide)
                {
                    shord[d] = shapeorders(ish,d);
                    if (shord[d] > maxorder[d]) {
                        include = false;
                    }
                }
                else
                {
                    DebugStop();
                }
            }
            if (include)
            {
                data.fSDVecShapeIndex[count] = std::make_pair(ivec, ish);
                count++;
            }
        }
    }

    int ivs =  data.fSDVecShapeIndex.size();
    if (count != ivs) {
        std::cout<<"count "<<count
                 <<"\nivs "<<ivs<<std::endl;
        DebugStop();
    }
    
}